

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall
QKmsDevice::QKmsDevice(QKmsDevice *this,QKmsScreenConfig *screenConfig,QString *path)

{
  bool bVar1;
  char *pcVar2;
  char *in_RDX;
  QMessageLogger *in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QKmsScreenConfig *in_stack_ffffffffffffff08;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  char local_b8 [32];
  char local_98 [56];
  char local_60 [56];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->category)->d = (Data *)&PTR__QKmsDevice_00147370;
  *(QMessageLogger **)&in_RDI->control = in_RSI;
  this_00 = in_RDI;
  QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff08);
  *(undefined4 *)&in_RDI[2].control = 0xffffffff;
  in_RDI[2].field_0xc = 0;
  QThreadStorage<QKmsDevice::AtomicReqs>::QThreadStorage
            ((QThreadStorage<QKmsDevice::AtomicReqs> *)0x118a53);
  *(undefined4 *)((long)&((DataPointer *)&in_RDI[3].category)->d + 4) = 0;
  QList<QKmsPlane>::QList((QList<QKmsPlane> *)0x118a68);
  bVar1 = QString::isEmpty((QString *)0x118a76);
  if (bVar1) {
    QKmsScreenConfig::devicePath(in_stack_ffffffffffffff08);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_ffffffffffffff08);
    QString::~QString((QString *)0x118ab8);
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)in_stack_ffffffffffffff08);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x118b0e);
      QMessageLogger::QMessageLogger
                (in_RSI,in_RDX,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff08,
                 (char *)0x118b27);
      QtPrivate::asString((QString *)(in_RDI + 1));
      QString::toLocal8Bit((QString *)this_00);
      pcVar2 = QByteArray::constData((QByteArray *)0x118b52);
      QMessageLogger::debug(local_60,"Using DRM device %s specified in config file",pcVar2);
      QByteArray::~QByteArray((QByteArray *)0x118b78);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    bVar1 = QString::isEmpty((QString *)0x118b93);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                (in_RSI,in_RDX,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff08);
      QMessageLogger::fatal(local_98,"No DRM device given");
    }
  }
  else {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)in_stack_ffffffffffffff08);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x118c17);
      QMessageLogger::QMessageLogger
                (in_RSI,in_RDX,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff08,
                 (char *)0x118c2d);
      QtPrivate::asString((QString *)(in_RDI + 1));
      QString::toLocal8Bit((QString *)this_00);
      pcVar2 = QByteArray::constData((QByteArray *)0x118c52);
      QMessageLogger::debug(local_b8,"Using backend-provided DRM device %s",pcVar2);
      QByteArray::~QByteArray((QByteArray *)0x118c72);
      local_20 = local_20 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QKmsDevice::QKmsDevice(QKmsScreenConfig *screenConfig, const QString &path)
    : m_screenConfig(screenConfig)
    , m_path(path)
    , m_dri_fd(-1)
    , m_has_atomic_support(false)
    , m_crtc_allocator(0)
{
    if (m_path.isEmpty()) {
        m_path = m_screenConfig->devicePath();
        qCDebug(qLcKmsDebug, "Using DRM device %s specified in config file", qPrintable(m_path));
        if (m_path.isEmpty())
            qFatal("No DRM device given");
    } else {
        qCDebug(qLcKmsDebug, "Using backend-provided DRM device %s", qPrintable(m_path));
    }
}